

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O0

int xmlwrite_sum(archive_write *a,xml_writer *writer,char *key,chksumval_conflict *sum)

{
  int iVar1;
  uchar *puVar2;
  char *hex;
  int r;
  int i;
  uchar *s;
  char *p;
  char buff [41];
  int algsize;
  char *algname;
  chksumval_conflict *sum_local;
  char *key_local;
  xml_writer *writer_local;
  archive_write *a_local;
  
  if (sum->len != 0) {
    register0x00000000 = getalgname(sum->alg);
    buff._36_4_ = getalgsize(sum->alg);
    if (stack0xffffffffffffffc8 != (char *)0x0) {
      s = (uchar *)&p;
      _r = sum->val;
      for (hex._4_4_ = 0; hex._4_4_ < (int)buff._36_4_; hex._4_4_ = hex._4_4_ + 1) {
        puVar2 = s + 1;
        *s = "0123456789abcdef"[(int)(uint)*_r >> 4];
        s = s + 2;
        *puVar2 = "0123456789abcdef"[(int)(*_r & 0xf)];
        _r = _r + 1;
      }
      *s = '\0';
      iVar1 = xmlwrite_string_attr(a,writer,key,(char *)&p,"style",stack0xffffffffffffffc8);
      if (iVar1 < 0) {
        return -0x1e;
      }
    }
  }
  return 0;
}

Assistant:

static int
xmlwrite_sum(struct archive_write *a, struct xml_writer *writer,
	const char *key, struct chksumval *sum)
{
	const char *algname;
	int algsize;
	char buff[MAX_SUM_SIZE*2 + 1];
	char *p;
	unsigned char *s;
	int i, r;

	if (sum->len > 0) {
		algname = getalgname(sum->alg);
		algsize = getalgsize(sum->alg);
		if (algname != NULL) {
			const char *hex = "0123456789abcdef";
			p = buff;
			s = sum->val;
			for (i = 0; i < algsize; i++) {
				*p++ = hex[(*s >> 4)];
				*p++ = hex[(*s & 0x0f)];
				s++;
			}
			*p = '\0';
			r = xmlwrite_string_attr(a, writer,
			    key, buff,
			    "style", algname);
			if (r < 0)
				return (ARCHIVE_FATAL);
		}
	}
	return (ARCHIVE_OK);
}